

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O2

EStatusCode __thiscall
AbstractContentContext::CS(AbstractContentContext *this,string *inColorSpaceName)

{
  EStatusCode EVar1;
  allocator<char> local_39;
  string local_38;
  
  EVar1 = (*this->_vptr_AbstractContentContext[5])();
  if (EVar1 != eSuccess) {
    this->mCurrentStatusCode = EVar1;
  }
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  PrimitiveObjectsWriter::WriteName(&this->mPrimitiveWriter,inColorSpaceName,eTokenSeparatorSpace);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"CS",&local_39);
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::CS(const std::string& inColorSpaceName)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);

	mPrimitiveWriter.WriteName(inColorSpaceName);
	mPrimitiveWriter.WriteKeyword("CS");
	return GetCurrentStatusCode();
}